

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::Bloaty::AddFilename(Bloaty *this,string *filename,bool is_base)

{
  pointer pOVar1;
  byte in_DL;
  string *in_RSI;
  long in_RDI;
  string build_id;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> object_file;
  value_type *in_stack_fffffffffffffef8;
  InputFileInfo *in_stack_ffffffffffffff00;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [16];
  string *in_stack_ffffffffffffffa0;
  Bloaty *in_stack_ffffffffffffffa8;
  string local_40 [47];
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  GetObjectFile(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pOVar1 = std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
                     ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                      0x18bb23);
  (*pOVar1->_vptr_ObjectFile[2])(local_40);
  if ((local_11 & 1) == 0) {
    in_stack_ffffffffffffff00 = (InputFileInfo *)(in_RDI + 0x148);
    std::__cxx11::string::string(local_d0,local_10);
    std::__cxx11::string::string(local_b0,local_40);
    std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
    push_back((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
               *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    InputFileInfo::~InputFileInfo(in_stack_ffffffffffffff00);
  }
  else {
    std::__cxx11::string::string(local_90,local_10);
    std::__cxx11::string::string(local_70,local_40);
    std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
    push_back((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
               *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    InputFileInfo::~InputFileInfo(in_stack_ffffffffffffff00);
  }
  std::__cxx11::string::~string(local_40);
  std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
            ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
             in_stack_ffffffffffffff00);
  return;
}

Assistant:

void Bloaty::AddFilename(const std::string& filename, bool is_base) {
  auto object_file = GetObjectFile(filename);
  std::string build_id = object_file->GetBuildId();

  if (is_base) {
    base_files_.push_back({filename, build_id});
  } else {
    input_files_.push_back({filename, build_id});
  }
}